

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

void __thiscall helics::ActionMessage::packetize(ActionMessage *this,string *data)

{
  size_type sVar1;
  int iVar2;
  
  iVar2 = serializedByteCount(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (data,(long)iVar2 + 4,'\0');
  toByteArray(this,(byte *)((data->_M_dataplus)._M_p + 4),(long)iVar2);
  *(data->_M_dataplus)._M_p = -0xd;
  sVar1 = data->_M_string_length;
  (data->_M_dataplus)._M_p[1] = (char)(sVar1 >> 0x10);
  (data->_M_dataplus)._M_p[2] = (char)(sVar1 >> 8);
  (data->_M_dataplus)._M_p[3] = (char)sVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (data,-6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (data,-4);
  return;
}

Assistant:

void ActionMessage::packetize(std::string& data) const
{
    auto size = serializedByteCount();
    data.resize(sizeof(uint32_t) + static_cast<size_t>(size));
    toByteArray(reinterpret_cast<std::byte*>(&(data[4])), size);

    data[0] = LEADING_CHAR;
    // now generate a length header
    auto dsz = static_cast<uint32_t>(data.size());
    data[1] = static_cast<char>(((dsz >> 16U) & 0xFFU));
    data[2] = static_cast<char>(((dsz >> 8U) & 0xFFU));
    data[3] = static_cast<char>(dsz & 0xFFU);
    data.push_back(TAIL_CHAR1);
    data.push_back(TAIL_CHAR2);
}